

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O0

int runeq(runcxdef *ctx)

{
  long lVar1;
  undefined8 uVar2;
  void *p;
  void *p_00;
  int iVar3;
  int iVar4;
  long in_RDI;
  runsdef val2;
  runsdef val1;
  byte local_39;
  char local_30;
  short local_28;
  char local_20;
  short local_18;
  uint local_4;
  
  lVar1 = *(long *)(in_RDI + 0x20);
  *(long *)(in_RDI + 0x20) = lVar1 + -0x10;
  uVar2 = *(undefined8 *)(lVar1 + -0x10);
  p = *(void **)(lVar1 + -8);
  lVar1 = *(long *)(in_RDI + 0x20);
  *(long *)(in_RDI + 0x20) = lVar1 + -0x10;
  p_00 = *(void **)(lVar1 + -8);
  local_20 = (char)uVar2;
  local_30 = (char)*(undefined8 *)(lVar1 + -0x10);
  if (local_20 == local_30) {
    local_18 = (short)p;
    local_28 = (short)p_00;
    switch(local_20) {
    case '\x01':
      local_4 = (uint)(p == p_00);
      break;
    case '\x02':
    case '\n':
      local_4 = (uint)(local_18 == local_28);
      break;
    case '\x03':
    case '\a':
      iVar3 = osrp2(p);
      iVar4 = osrp2(p_00);
      local_39 = 0;
      if (iVar3 == iVar4) {
        iVar3 = osrp2(p);
        iVar3 = memcmp(p,p_00,(long)iVar3);
        local_39 = iVar3 != 0 ^ 0xff;
      }
      local_4 = (uint)(local_39 & 1);
      break;
    default:
      local_4 = 1;
      break;
    case '\r':
      local_4 = (uint)(local_18 == local_28);
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int runeq(runcxdef *ctx)
{
    runsdef val1, val2;
    
    /* get values, and see if they have identical type; not equal if not */
    runpop(ctx, &val1);
    runpop(ctx, &val2);
    if (val1.runstyp != val2.runstyp) return(FALSE);
    
    /* types match, so check values */
    switch(val1.runstyp)
    {
    case DAT_NUMBER:
        return(val1.runsv.runsvnum == val2.runsv.runsvnum);
        
    case DAT_SSTRING:
    case DAT_LIST:
        return(osrp2(val1.runsv.runsvstr) == osrp2(val2.runsv.runsvstr)
               && !memcmp(val1.runsv.runsvstr, val2.runsv.runsvstr,
                          (size_t)osrp2(val1.runsv.runsvstr)));
        
    case DAT_PROPNUM:
        return(val1.runsv.runsvprp == val2.runsv.runsvprp);
        
    case DAT_OBJECT:
    case DAT_FNADDR:
        return(val1.runsv.runsvobj == val2.runsv.runsvobj);
        
    default:
        return(TRUE);
    }
}